

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexPointCloudShape.cpp
# Opt level: O3

void __thiscall
btConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btConvexPointCloudShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,
          int numVectors)

{
  undefined8 uVar1;
  btVector3 *pbVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  btScalar *pbVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  if (0 < numVectors) {
    uVar4 = 0;
    do {
      if ((long)this->m_numPoints < 1) {
        supportVerticesOut[uVar4].m_floats[3] = -1e+18;
      }
      else {
        pbVar2 = this->m_unscaledPoints;
        pbVar5 = pbVar2->m_floats + 2;
        uVar6 = 0xffffffff;
        uVar7 = 0;
        fVar8 = -3.4028235e+38;
        do {
          fVar9 = *pbVar5 * vectors[uVar4].m_floats[2] *
                            *(float *)&(this->super_btPolyhedralConvexAabbCachingShape).
                                       super_btPolyhedralConvexShape.super_btConvexInternalShape.
                                       field_0x24 +
                  ((btVector3 *)(pbVar5 + -2))->m_floats[0] *
                  vectors[uVar4].m_floats[0] *
                  *(float *)&(this->super_btPolyhedralConvexAabbCachingShape).
                             super_btPolyhedralConvexShape.super_btConvexInternalShape.
                             super_btConvexShape.super_btCollisionShape.field_0x1c +
                  pbVar5[-1] *
                  vectors[uVar4].m_floats[1] *
                  *(float *)&(this->super_btPolyhedralConvexAabbCachingShape).
                             super_btPolyhedralConvexShape.super_btConvexInternalShape.field_0x20;
          if (fVar8 < fVar9) {
            uVar6 = uVar7 & 0xffffffff;
            fVar8 = fVar9;
          }
          uVar7 = uVar7 + 1;
          pbVar5 = pbVar5 + 4;
        } while ((long)this->m_numPoints != uVar7);
        supportVerticesOut[uVar4].m_floats[3] = -1e+18;
        if (-1 < (int)uVar6) {
          uVar1 = *(undefined8 *)
                   &(this->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
                    super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
                    field_0x1c;
          auVar3._4_4_ = (float)((ulong)uVar1 >> 0x20) *
                         (float)((ulong)*(undefined8 *)pbVar2[uVar6].m_floats >> 0x20);
          auVar3._0_4_ = (float)uVar1 * (float)*(undefined8 *)pbVar2[uVar6].m_floats;
          auVar3._8_4_ = pbVar2[uVar6].m_floats[2] *
                         *(float *)&(this->super_btPolyhedralConvexAabbCachingShape).
                                    super_btPolyhedralConvexShape.super_btConvexInternalShape.
                                    field_0x24;
          auVar3._12_4_ = 0;
          *(undefined1 (*) [16])supportVerticesOut[uVar4].m_floats = auVar3;
          supportVerticesOut[uVar4].m_floats[3] = fVar8;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)numVectors);
  }
  return;
}

Assistant:

void	btConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
{
    for( int j = 0; j < numVectors; j++ )
    {
        const btVector3& vec = vectors[j] * m_localScaling;  // dot( a*c, b) = dot(a, b*c)
        btScalar maxDot;
        int index = (int) vec.maxDot( &m_unscaledPoints[0], m_numPoints, maxDot);
        supportVerticesOut[j][3] = btScalar(-BT_LARGE_FLOAT);
        if( 0 <= index )
        {
            //WARNING: don't swap next lines, the w component would get overwritten!
            supportVerticesOut[j] = getScaledPoint(index);
            supportVerticesOut[j][3] = maxDot;
        }
    }

}